

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::EdgeControlSpecifierSyntax::EdgeControlSpecifierSyntax
          (EdgeControlSpecifierSyntax *this,Token openBracket,
          SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *descriptors,Token closeBracket)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  EdgeDescriptorSyntax *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::EdgeDescriptorSyntax_*> local_30;
  
  uVar5 = openBracket._0_8_;
  uVar6 = closeBracket._0_8_;
  (this->super_SyntaxNode).kind = EdgeControlSpecifier;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->openBracket).kind = (short)uVar5;
  (this->openBracket).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBracket).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBracket).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBracket).info = openBracket.info;
  uVar3 = *(undefined4 *)&(descriptors->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (descriptors->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->descriptors).super_SyntaxListBase.super_SyntaxNode.kind =
       (descriptors->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->descriptors).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->descriptors).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->descriptors).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (descriptors->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->descriptors).super_SyntaxListBase.childCount =
       (descriptors->super_SyntaxListBase).childCount;
  (this->descriptors).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006797d8;
  sVar1 = (descriptors->elements)._M_extent._M_extent_value;
  (this->descriptors).elements._M_ptr = (descriptors->elements)._M_ptr;
  (this->descriptors).elements._M_extent._M_extent_value = sVar1;
  (this->closeBracket).kind = (short)uVar6;
  (this->closeBracket).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeBracket).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeBracket).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeBracket).info = closeBracket.info;
  (this->descriptors).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->descriptors).elements._M_extent._M_extent_value;
  local_30.list = &this->descriptors;
  for (; (local_30.list != &this->descriptors || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::EdgeDescriptorSyntax>::
             iterator_base<slang::syntax::EdgeDescriptorSyntax_*>::dereference(&local_30);
    (pEVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

EdgeControlSpecifierSyntax(Token openBracket, const SeparatedSyntaxList<EdgeDescriptorSyntax>& descriptors, Token closeBracket) :
        SyntaxNode(SyntaxKind::EdgeControlSpecifier), openBracket(openBracket), descriptors(descriptors), closeBracket(closeBracket) {
        this->descriptors.parent = this;
        for (auto child : this->descriptors)
            child->parent = this;
    }